

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O1

void __thiscall StreamSummary<4U>::Add_Counter(StreamSummary<4U> *this,Data<4U> *data,bool empty)

{
  StreamBucket **ppSVar1;
  StreamBucket *prev;
  Node<int> *pNVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  Node<int> *pNVar6;
  Node<int> *pNVar7;
  StreamBucket **ppSVar8;
  StreamCounter *counter;
  mapped_type *ppSVar9;
  int iVar10;
  undefined7 in_register_00000011;
  
  iVar10 = (int)CONCAT71(in_register_00000011,empty);
  ppSVar1 = &this->min_bucket;
  ppSVar8 = (StreamBucket **)&(this->min_bucket->super_Node<int>).next;
  if (iVar10 != 0) {
    ppSVar8 = ppSVar1;
  }
  prev = *ppSVar8;
  counter = (StreamCounter *)operator_new(0x20);
  *(undefined4 *)(counter->super_Node<Data<4U>_>).ID.str = *(undefined4 *)data->str;
  (counter->super_Node<Data<4U>_>).prev = (Node<Data<4U>_> *)0x0;
  (counter->super_Node<Data<4U>_>).next = (Node<Data<4U>_> *)0x0;
  counter->parent = (StreamBucket *)0x0;
  Add_Bucket(this,prev,counter);
  ppSVar9 = std::__detail::
            _Map_base<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->mp,data);
  *ppSVar9 = counter;
  if (iVar10 != 0) {
    return;
  }
  pNVar2 = ((*ppSVar1)->super_Node<int>).next;
  pvVar3 = *(void **)(pNVar2 + 1);
  *(undefined8 *)(pNVar2 + 1) = *(undefined8 *)((long)pvVar3 + 0x10);
  std::
  _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_erase(&(this->mp)._M_h,pvVar3);
  lVar4 = *(long *)((long)pvVar3 + 8);
  lVar5 = *(long *)((long)pvVar3 + 0x10);
  if (lVar4 != 0) {
    *(long *)(lVar4 + 0x10) = lVar5;
  }
  if (lVar5 != 0) {
    *(long *)(lVar5 + 8) = lVar4;
  }
  if (*(long *)((long)pvVar3 + 0x10) == 0) {
    pNVar2 = ((*ppSVar1)->super_Node<int>).next;
    pNVar6 = pNVar2->prev;
    pNVar7 = pNVar2->next;
    if (pNVar6 != (Node<int> *)0x0) {
      pNVar6->next = pNVar7;
    }
    if (pNVar7 != (Node<int> *)0x0) {
      pNVar7->prev = pNVar6;
    }
    operator_delete(pNVar2,0x20);
  }
  operator_delete(pvVar3,0x20);
  return;
}

Assistant:

void Add_Counter(const Data<DATA_LEN>& data, bool empty) {
		StreamBucket* prev = empty ? min_bucket : (StreamBucket*)min_bucket->next;

		StreamCounter* add = new StreamCounter(data);
		Add_Bucket(prev, add);
		mp[data] = add;

		if (!empty) {
			StreamCounter* temp = Min_Bucket()->child;
			Min_Bucket()->child = (StreamCounter*)temp->next;
			mp.erase(temp->ID);
			temp->Delete();
			if (temp->next == NULL) {
				StreamBucket* bucket = (StreamBucket*)min_bucket->next;
				bucket->Delete();
				delete bucket;
			}
			delete temp;
		}
	}